

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmscan.c
# Opt level: O3

void thanm_yyrestart(FILE *input_file)

{
  YY_BUFFER_STATE b;
  
  if ((yy_buffer_stack == (YY_BUFFER_STATE *)0x0) ||
     (b = yy_buffer_stack[yy_buffer_stack_top], b == (YY_BUFFER_STATE)0x0)) {
    thanm_yyensure_buffer_stack();
    b = thanm_yy_create_buffer(thanm_yyin,0x4000);
    yy_buffer_stack[yy_buffer_stack_top] = b;
  }
  thanm_yy_init_buffer(b,input_file);
  yy_n_chars = yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars;
  yy_c_buf_p = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_pos;
  thanm_yytext = yy_c_buf_p;
  thanm_yyin = yy_buffer_stack[yy_buffer_stack_top]->yy_input_file;
  yy_hold_char = *yy_c_buf_p;
  return;
}

Assistant:

void yyrestart  (FILE * input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}